

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  int i;
  int iVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int len;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar14;
  secp256k1_modinv64_modinfo *local_118;
  secp256k1_modinv64_signed62 *local_110;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_58;
  ulong uVar13;
  
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[4] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  f.v[4] = (modinfo->modulus).v[4];
  f.v[0] = (modinfo->modulus).v[0];
  f.v[1] = (modinfo->modulus).v[1];
  f.v[2] = (modinfo->modulus).v[2];
  f.v[3] = (modinfo->modulus).v[3];
  g.v[4] = x->v[4];
  g.v[0] = x->v[0];
  g.v[1] = x->v[1];
  g.v[2] = x->v[2];
  g.v[3] = x->v[3];
  len = 5;
  lVar14 = -1;
  lVar2 = 1;
  local_118 = modinfo;
  local_110 = x;
  do {
    t.v = 0;
    t.q = 0;
    iVar3 = 0x3e;
    t.u = lVar2;
    uVar11 = g.v[0];
    t.r = lVar2;
    uVar13 = f.v[0];
    while( true ) {
      uVar7 = -1L << ((byte)iVar3 & 0x3f) | uVar11;
      lVar9 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      bVar4 = (byte)lVar9;
      uVar7 = uVar11 >> (bVar4 & 0x3f);
      t.u = t.u << (bVar4 & 0x3f);
      t.v = t.v << (bVar4 & 0x3f);
      lVar14 = lVar14 - lVar9;
      iVar3 = iVar3 - (int)lVar9;
      if (iVar3 == 0) break;
      iVar10 = (int)uVar7;
      if (lVar14 < 0) {
        lVar14 = -lVar14;
        uVar11 = -uVar13;
        lVar9 = -t.u;
        lVar8 = -t.v;
        iVar6 = (int)lVar14 + 1;
        cVar5 = (char)iVar6;
        if (iVar3 <= iVar6) {
          cVar5 = (char)iVar3;
        }
        uVar12 = (uint)(0xffffffffffffffff >> (-cVar5 & 0x3fU)) &
                 (iVar10 * iVar10 + 0x3e) * iVar10 * (int)uVar11 & 0x3f;
        t.u = t.q;
        t.v = t.r;
      }
      else {
        iVar6 = (int)lVar14 + 1;
        cVar5 = (char)iVar6;
        if (iVar3 <= iVar6) {
          cVar5 = (char)iVar3;
        }
        uVar12 = (uint)(0xffffffffffffffff >> (-cVar5 & 0x3fU)) &
                 -(iVar10 * (((int)uVar13 * 2 + 2U & 8) + (int)uVar13)) & 0xf;
        lVar9 = t.q;
        uVar11 = uVar7;
        lVar8 = t.r;
        uVar7 = uVar13;
      }
      uVar13 = (ulong)uVar12;
      uVar11 = uVar11 + uVar13 * uVar7;
      t.q = t.u * uVar13 + lVar9;
      t.r = lVar8 + uVar13 * t.v;
      uVar13 = uVar7;
    }
    secp256k1_modinv64_update_de_62(&d,&local_58,&t,local_118);
    secp256k1_modinv64_update_fg_62_var(len,&f,&g,&t);
    lVar9 = (long)len;
    if (g.v[0] == 0) {
      uVar11 = 0;
      for (lVar8 = lVar2; lVar8 < lVar9; lVar8 = lVar8 + 1) {
        uVar11 = uVar11 | g.v[lVar8];
      }
      if (uVar11 == 0) {
        secp256k1_modinv64_normalize_62(&d,f.v[lVar9 + -1],local_118);
        local_110->v[4] = d.v[4];
        local_110->v[2] = d.v[2];
        local_110->v[3] = d.v[3];
        local_110->v[0] = d.v[0];
        local_110->v[1] = d.v[1];
        return;
      }
    }
    lVar8 = f.v[lVar9 + -1];
    lVar1 = g.v[lVar9 + -1];
    if (lVar1 >> 0x3f == lVar1 && (lVar8 >> 0x3f == lVar8 && -1 < lVar9 + -2)) {
      len = len + -1;
      f.v[lVar9 + -2] = f.v[lVar9 + -2] | lVar8 << 0x3e;
      (&local_118)[lVar9] =
           (secp256k1_modinv64_modinfo *)((ulong)(&local_118)[lVar9] | lVar1 << 0x3e);
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}